

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.h
# Opt level: O3

void __thiscall CRegexStack::save_loop_var(CRegexStack *this,int id,short *loop_vars)

{
  char *ret;
  int *piVar1;
  int *piVar2;
  
  if ((long)this->sp_ != -1) {
    piVar2 = (int *)(this->buf_ + (long)this->sp_ + 0x24);
    piVar1 = (int *)(this->buf_ + this->used_);
    while( true ) {
      if (piVar1 <= piVar2) {
        this->used_ = this->used_ + 0xc;
        *piVar1 = id + 10;
        *(short *)(piVar1 + 1) = loop_vars[id];
        return;
      }
      if (*piVar2 == id + 10) break;
      piVar2 = piVar2 + 3;
    }
  }
  return;
}

Assistant:

void save_loop_var(int id, const short *loop_vars)
    {
        /* 
         *   allocate a new slot if needed and save the value; note that
         *   loop variables are identified by the loop variable ID plus the
         *   base index RE_GROUP_REG_CNT 
         */
        regex_stack_var *var;
        if (sp_ != -1 && (var = new_reg_or_var(id + RE_GROUP_REG_CNT)) != 0)
            var->val.loopvar = loop_vars[id];
    }